

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O2

exr_result_t exr_decoding_destroy(exr_const_context_t ctxt,exr_decode_pipeline_t *decode)

{
  exr_result_t eVar1;
  
  if (ctxt == (exr_const_context_t)0x0) {
    eVar1 = 2;
  }
  else if (decode == (exr_decode_pipeline_t *)0x0) {
    eVar1 = 0;
  }
  else {
    if (decode->channels != decode->_quick_chan_store) {
      (**(code **)(ctxt + 0x60))();
    }
    if ((decode->unpacked_buffer == decode->packed_buffer) && (decode->unpacked_alloc_size == 0)) {
      decode->unpacked_buffer = (void *)0x0;
    }
    eVar1 = 0;
    internal_decode_free_buffer
              (decode,EXR_TRANSCODE_BUFFER_PACKED,&decode->packed_buffer,&decode->packed_alloc_size)
    ;
    internal_decode_free_buffer
              (decode,EXR_TRANSCODE_BUFFER_UNPACKED,&decode->unpacked_buffer,
               &decode->unpacked_alloc_size);
    internal_decode_free_buffer
              (decode,EXR_TRANSCODE_BUFFER_SCRATCH1,&decode->scratch_buffer_1,
               &decode->scratch_alloc_size_1);
    internal_decode_free_buffer
              (decode,EXR_TRANSCODE_BUFFER_SCRATCH2,&decode->scratch_buffer_2,
               &decode->scratch_alloc_size_2);
    internal_decode_free_buffer
              (decode,EXR_TRANSCODE_BUFFER_PACKED_SAMPLES,&decode->packed_sample_count_table,
               &decode->packed_sample_count_alloc_size);
    internal_decode_free_buffer
              (decode,EXR_TRANSCODE_BUFFER_SAMPLES,&decode->sample_count_table,
               &decode->sample_count_alloc_size);
    memset(decode,0,0x1e0);
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_decoding_destroy (exr_const_context_t ctxt, exr_decode_pipeline_t* decode)
{
    INTERN_EXR_PROMOTE_CONST_CONTEXT_OR_ERROR (ctxt);
    if (decode)
    {
        exr_decode_pipeline_t nil = {0};
        if (decode->channels != decode->_quick_chan_store)
            pctxt->free_fn (decode->channels);

        if (decode->unpacked_buffer == decode->packed_buffer &&
            decode->unpacked_alloc_size == 0)
            decode->unpacked_buffer = NULL;

        internal_decode_free_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_PACKED,
            (void**) &(decode->packed_buffer),
            &(decode->packed_alloc_size));
        internal_decode_free_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_UNPACKED,
            (void**) &(decode->unpacked_buffer),
            &(decode->unpacked_alloc_size));
        internal_decode_free_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_SCRATCH1,
            &(decode->scratch_buffer_1),
            &(decode->scratch_alloc_size_1));
        internal_decode_free_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_SCRATCH2,
            &(decode->scratch_buffer_2),
            &(decode->scratch_alloc_size_2));
        internal_decode_free_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_PACKED_SAMPLES,
            &(decode->packed_sample_count_table),
            &(decode->packed_sample_count_alloc_size));
        internal_decode_free_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_SAMPLES,
            (void**) &(decode->sample_count_table),
            &(decode->sample_count_alloc_size));
        *decode = nil;
    }
    return EXR_ERR_SUCCESS;
}